

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O1

void vorbis_book_clear(codebook *b)

{
  if (b->valuelist != (float *)0x0) {
    free(b->valuelist);
  }
  if (b->codelist != (ogg_uint32_t *)0x0) {
    free(b->codelist);
  }
  if (b->dec_index != (int *)0x0) {
    free(b->dec_index);
  }
  if (b->dec_codelengths != (char *)0x0) {
    free(b->dec_codelengths);
  }
  if (b->dec_firsttable != (ogg_uint32_t *)0x0) {
    free(b->dec_firsttable);
  }
  b->quantvals = 0;
  b->minval = 0;
  *(undefined8 *)&b->delta = 0;
  b->dec_firsttable = (ogg_uint32_t *)0x0;
  b->dec_firsttablen = 0;
  b->dec_maxlength = 0;
  b->dec_index = (int *)0x0;
  b->dec_codelengths = (char *)0x0;
  b->valuelist = (float *)0x0;
  b->codelist = (ogg_uint32_t *)0x0;
  b->used_entries = 0;
  b->c = (static_codebook *)0x0;
  b->dim = 0;
  b->entries = 0;
  return;
}

Assistant:

void vorbis_book_clear(codebook *b){
  /* static book is not cleared; we're likely called on the lookup and
     the static codebook belongs to the info struct */
  if(b->valuelist)_ogg_free(b->valuelist);
  if(b->codelist)_ogg_free(b->codelist);

  if(b->dec_index)_ogg_free(b->dec_index);
  if(b->dec_codelengths)_ogg_free(b->dec_codelengths);
  if(b->dec_firsttable)_ogg_free(b->dec_firsttable);

  memset(b,0,sizeof(*b));
}